

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

bool __thiscall SQInstance::Set(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  SQObjectPtr idx;
  SQObjectPtr *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SQObjectPtr *in_stack_ffffffffffffffc8;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQObjectValue in_stack_ffffffffffffffd8;
  bool local_1;
  
  this_00 = (SQObjectPtr *)&stack0xffffffffffffffd0;
  ::SQObjectPtr::SQObjectPtr(this_00);
  bVar1 = SQTable::Get(in_stack_ffffffffffffffd8.pTable,in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  if ((bVar1) && ((in_stack_ffffffffffffffd8.nInteger & 0x2000000U) != 0)) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (SQObjectPtr *)CONCAT17(bVar1,in_stack_ffffffffffffffb8));
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return local_1;
}

Assistant:

bool Set(const SQObjectPtr &key,const SQObjectPtr &val) {
        SQObjectPtr idx;
        if(_class->_members->Get(key,idx) && _isfield(idx)) {
            _values[_member_idx(idx)] = val;
            return true;
        }
        return false;
    }